

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addPHIOperands(LLVMPointerGraphBuilder *this,Function *F)

{
  PSNode *node;
  PSNodesSeq *pPVar1;
  Function *pFVar2;
  Function *pFVar3;
  Function *pFVar4;
  Function *pFVar5;
  Function *val;
  
  pFVar4 = *(Function **)(F + 0x50);
  if (pFVar4 != F + 0x48) {
    do {
      pFVar3 = pFVar4 + -0x18;
      if (pFVar4 == (Function *)0x0) {
        pFVar3 = (Function *)0x0;
      }
      for (pFVar2 = *(Function **)(pFVar3 + 0x30); pFVar2 != pFVar3 + 0x28;
          pFVar2 = *(Function **)(pFVar2 + 8)) {
        pFVar5 = pFVar2 + -0x18;
        if (pFVar2 == (Function *)0x0) {
          pFVar5 = (Function *)0x0;
        }
        val = pFVar5;
        if (pFVar5[0x10] != (Function)0x52) {
          val = (Function *)(Value *)0x0;
        }
        if (pFVar5[0x10] == (Function)0x52 && pFVar2 != (Function *)0x0) {
          pPVar1 = getNodes(this,(Value *)val);
          node = *(pPVar1->_nodes).
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
          if (node != (PSNode *)0x0) {
            addPHIOperands(this,node,(PHINode *)val);
          }
        }
      }
      pFVar4 = *(Function **)(pFVar4 + 8);
    } while (pFVar4 != F + 0x48);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addPHIOperands(const llvm::Function &F) {
    for (const llvm::BasicBlock &B : F) {
        for (const llvm::Instruction &I : B) {
            if (const llvm::PHINode *PHI = llvm::dyn_cast<llvm::PHINode>(&I)) {
                if (PSNode *node = getNodes(PHI)->getSingleNode())
                    addPHIOperands(node, PHI);
            }
        }
    }
}